

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          string_view_type *key)

{
  json_storage_kind jVar1;
  bool bVar2;
  iterator this_00;
  iterator key_00;
  reference this_01;
  undefined8 uVar3;
  order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  iterator it;
  order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffff98;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffffe0;
  value_type *local_8;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == empty_object) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::basic_string_view<char,_std::char_traits<char>_>::data
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI);
    key_not_found::key_not_found<char>
              ((key_not_found *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8,
               CONCAT17(jVar1,in_stack_ffffffffffffffd0));
    __cxa_throw(uVar3,&key_not_found::typeinfo,key_not_found::~key_not_found);
  }
  if (jVar1 == json_reference) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffa0);
    json_reference_storage::value((json_reference_storage *)0x555d7b);
    local_8 = at((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_RSI,(string_view_type *)in_stack_ffffffffffffffe0._M_current);
  }
  else {
    if (jVar1 != object) {
      uVar3 = __cxa_allocate_exception(0x58);
      std::basic_string_view<char,_std::char_traits<char>_>::data
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI);
      std::basic_string_view<char,_std::char_traits<char>_>::length
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI);
      not_an_object::not_an_object<char>
                ((not_an_object *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8,
                 CONCAT17(jVar1,in_stack_ffffffffffffffd0));
      __cxa_throw(uVar3,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
              (in_stack_ffffffffffffffa0);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
    value_abi_cxx11_((object_storage *)in_stack_ffffffffffffffe0._M_current);
    this_00 = order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
              ::find(in_RSI,in_stack_ffffffffffffffe0._M_current);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
              (in_stack_ffffffffffffffa0);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
    value_abi_cxx11_((object_storage *)this_00._M_current);
    key_00 = order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
             ::end(in_stack_ffffffffffffff98);
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (bVar2) {
      uVar3 = __cxa_allocate_exception(0x58);
      std::basic_string_view<char,_std::char_traits<char>_>::data
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI);
      std::basic_string_view<char,_std::char_traits<char>_>::length
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI);
      key_not_found::key_not_found<char>
                ((key_not_found *)this_00._M_current,(char *)key_00._M_current,
                 CONCAT17(jVar1,in_stack_ffffffffffffffd0));
      __cxa_throw(uVar3,&key_not_found::typeinfo,key_not_found::~key_not_found);
    }
    this_01 = __gnu_cxx::
              __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
              ::operator*((__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                           *)&stack0xffffffffffffffe0);
    local_8 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::value(this_01);
  }
  return local_8;
}

Assistant:

basic_json& at(const string_view_type& key)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    JSONCONS_THROW(key_not_found(key.data(),key.length()));
                case json_storage_kind::object:
                {
                    auto it = cast<object_storage>().value().find(key);
                    if (it == cast<object_storage>().value().end())
                    {
                        JSONCONS_THROW(key_not_found(key.data(),key.length()));
                    }
                    return (*it).value();
                }
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().at(key);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }